

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotErrorBarsHEx<ImPlot::GetterError<double>>
               (char *label_id,GetterError<double> *getter)

{
  double dVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col;
  long lVar4;
  ImDrawList *this;
  int iVar5;
  int iVar6;
  float fVar7;
  ImVec2 p1;
  ImVec2 p2;
  undefined1 local_70 [8];
  double local_68;
  double local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  
  bVar3 = BeginItem(label_id,-1);
  if (bVar3) {
    if ((GImPlot->FitThisFrame == true) && (iVar5 = getter->Count, 0 < iVar5)) {
      iVar6 = 0;
      do {
        lVar4 = (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Xs + lVar4);
        local_68 = *(double *)((long)getter->Ys + lVar4);
        local_70 = (undefined1  [8])(dVar1 - *(double *)((long)getter->Neg + lVar4));
        local_58 = (ImVec2)(dVar1 + *(double *)((long)getter->Pos + lVar4));
        local_60 = local_68;
        FitPoint((ImPlotPoint *)local_70);
        local_70._0_4_ = local_58.x;
        local_70._4_4_ = local_58.y;
        local_68 = local_60;
        FitPoint((ImPlotPoint *)local_70);
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar2 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 4);
    iVar5 = getter->Count;
    if (0 < iVar5) {
      local_44 = (pIVar2->NextItemData).ErrorBarSize;
      fVar7 = local_44 * 0.5;
      iVar6 = 0;
      do {
        lVar4 = (long)(((getter->Offset + iVar6) % iVar5 + iVar5) % iVar5) * (long)getter->Stride;
        dVar1 = *(double *)((long)getter->Xs + lVar4);
        local_60 = *(double *)((long)getter->Ys + lVar4);
        local_58 = (ImVec2)(dVar1 + *(double *)((long)getter->Pos + lVar4));
        local_70 = (undefined1  [8])
                   PlotToPixels(dVar1 - *(double *)((long)getter->Neg + lVar4),local_60,-1);
        local_50 = PlotToPixels((double)local_58,local_60,-1);
        ImDrawList::AddLine(this,(ImVec2 *)local_70,&local_50,col,
                            (pIVar2->NextItemData).ErrorBarWeight);
        if (0.0 < local_44) {
          local_38.y = (float)local_70._4_4_ - fVar7;
          local_38.x = (float)local_70._0_4_;
          local_40.x = (float)local_70._0_4_ + 0.0;
          local_40.y = (float)local_70._4_4_ + fVar7;
          ImDrawList::AddLine(this,&local_38,&local_40,col,(pIVar2->NextItemData).ErrorBarWeight);
          local_38.y = local_50.y - fVar7;
          local_38.x = local_50.x;
          local_40.x = local_50.x + 0.0;
          local_40.y = local_50.y + fVar7;
          ImDrawList::AddLine(this,&local_38,&local_40,col,(pIVar2->NextItemData).ErrorBarWeight);
        }
        iVar6 = iVar6 + 1;
        iVar5 = getter->Count;
      } while (iVar6 < iVar5);
    }
    pIVar2 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar2->NextItemData);
    pIVar2->PreviousItem = pIVar2->CurrentItem;
    pIVar2->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsHEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X - e.Neg, e.Y));
                FitPoint(ImPlotPoint(e.X + e.Pos, e.Y));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X - e.Neg, e.Y);
            ImVec2 p2 = PlotToPixels(e.X + e.Pos, e.Y);
            DrawList.AddLine(p1, p2, col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(0, half_whisker), p1 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(0, half_whisker), p2 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}